

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
__thiscall duckdb::GetBaseStatsUnifier(duckdb *this,LogicalType *type)

{
  PhysicalType PVar1;
  undefined8 *__s;
  undefined *puVar2;
  uint8_t scale;
  uint8_t width;
  uint8_t local_22;
  uint8_t local_21;
  undefined8 local_20;
  
  switch(type->id_) {
  default:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NullStatsUnifier::vtable;
    break;
  case TINYINT:
  case SMALLINT:
  case INTEGER:
  case UTINYINT:
  case USMALLINT:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<int>::vtable;
    break;
  case BIGINT:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<long>::vtable;
    break;
  case DATE:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::date_t>::vtable;
    break;
  case TIME:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::dtime_t>::vtable;
    break;
  case TIMESTAMP_SEC:
  case TIMESTAMP:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::timestamp_t>::vtable;
    break;
  case TIMESTAMP_MS:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::timestamp_ms_t>::vtable;
    break;
  case TIMESTAMP_NS:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::timestamp_ns_t>::vtable;
    break;
  case DECIMAL:
    local_21 = DecimalType::GetWidth(type);
    local_22 = DecimalType::GetScale(type);
    PVar1 = type->physical_type_;
    if (PVar1 != INT16) {
      if (PVar1 == INT64) {
        make_uniq<duckdb::DecimalStatsUnifier<long>,unsigned_char&,unsigned_char&>
                  ((duckdb *)&local_20,&local_21,&local_22);
        goto LAB_010a4290;
      }
      if (PVar1 != INT32) {
        make_uniq<duckdb::NullStatsUnifier>();
        goto LAB_010a4290;
      }
    }
    make_uniq<duckdb::DecimalStatsUnifier<int>,unsigned_char&,unsigned_char&>
              ((duckdb *)&local_20,&local_21,&local_22);
LAB_010a4290:
    *(undefined8 *)this = local_20;
    return (unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>
           )(unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>
             )this;
  case FLOAT:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<float>::vtable;
    break;
  case DOUBLE:
  case UHUGEINT:
  case HUGEINT:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<double>::vtable;
    break;
  case VARCHAR:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &StringStatsUnifier::vtable;
    break;
  case BLOB:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &BlobStatsUnifier::vtable;
    break;
  case UINTEGER:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<unsigned_int>::vtable;
    break;
  case UBIGINT:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<unsigned_long>::vtable;
    break;
  case TIMESTAMP_TZ:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::timestamp_tz_t>::vtable;
    break;
  case TIME_TZ:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::dtime_tz_t>::vtable;
    break;
  case UUID:
    __s = (undefined8 *)operator_new(0x88);
    switchD_005700f1::default(__s,0,0x88);
    __s[1] = __s + 3;
    __s[2] = 0;
    *(undefined1 *)(__s + 3) = 0;
    __s[5] = __s + 7;
    __s[6] = 0;
    *(undefined1 *)(__s + 7) = 0;
    __s[9] = __s + 0xb;
    __s[10] = 0;
    *(undefined1 *)(__s + 0xb) = 0;
    __s[0xd] = 0;
    *(undefined4 *)(__s + 0xe) = 0x101;
    __s[0xf] = 0;
    *(undefined2 *)(__s + 0x10) = 0;
    puVar2 = &UUIDStatsUnifier::vtable;
  }
  *__s = puVar2 + 0x10;
  *(undefined8 **)this = __s;
  return (unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>)
         (unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>)
         this;
}

Assistant:

unique_ptr<ColumnStatsUnifier> GetBaseStatsUnifier(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<NullStatsUnifier>();
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
		return make_uniq<NumericStatsUnifier<int32_t>>();
	case LogicalTypeId::DATE:
		return make_uniq<NumericStatsUnifier<date_t>>();
	case LogicalTypeId::BIGINT:
		return make_uniq<NumericStatsUnifier<int64_t>>();
	case LogicalTypeId::TIME:
		return make_uniq<NumericStatsUnifier<dtime_t>>();
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP:
		return make_uniq<NumericStatsUnifier<timestamp_t>>();
	case LogicalTypeId::TIMESTAMP_TZ:
		return make_uniq<NumericStatsUnifier<timestamp_tz_t>>();
	case LogicalTypeId::TIMESTAMP_MS:
		return make_uniq<NumericStatsUnifier<timestamp_ms_t>>();
	case LogicalTypeId::TIMESTAMP_NS:
		return make_uniq<NumericStatsUnifier<timestamp_ns_t>>();
	case LogicalTypeId::TIME_TZ:
		return make_uniq<NumericStatsUnifier<dtime_tz_t>>();
	case LogicalTypeId::UINTEGER:
		return make_uniq<NumericStatsUnifier<uint32_t>>();
	case LogicalTypeId::UBIGINT:
		return make_uniq<NumericStatsUnifier<uint64_t>>();
	case LogicalTypeId::FLOAT:
		return make_uniq<NumericStatsUnifier<float>>();
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UHUGEINT:
	case LogicalTypeId::DOUBLE:
		return make_uniq<NumericStatsUnifier<double>>();
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
		case PhysicalType::INT32:
			return make_uniq<DecimalStatsUnifier<int32_t>>(width, scale);
		case PhysicalType::INT64:
			return make_uniq<DecimalStatsUnifier<int64_t>>(width, scale);
		default:
			return make_uniq<NullStatsUnifier>();
		}
	}
	case LogicalTypeId::BLOB:
		return make_uniq<BlobStatsUnifier>();
	case LogicalTypeId::VARCHAR:
		return make_uniq<StringStatsUnifier>();
	case LogicalTypeId::UUID:
		return make_uniq<UUIDStatsUnifier>();
	case LogicalTypeId::INTERVAL:;
	case LogicalTypeId::ENUM:
	default:
		return make_uniq<NullStatsUnifier>();
	}
}